

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O1

int compareXDBAtomRecs(void *avptr,void *bvptr)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  
  lVar1 = *(long *)(*avptr + 8);
  lVar2 = *(long *)(*bvptr + 8);
  lVar3 = *(long *)(lVar1 + 0x70);
  lVar4 = *(long *)(lVar2 + 0x70);
  iVar5 = strcmp((char *)(lVar3 + 0x3b),(char *)(lVar4 + 0x3b));
  if (iVar5 < 1) {
    if (-1 < iVar5) {
      if (*(int *)(lVar4 + 0x20) < *(int *)(lVar3 + 0x20)) goto LAB_001225ef;
      if (*(int *)(lVar4 + 0x20) <= *(int *)(lVar3 + 0x20)) {
        if (*(char *)(lVar4 + 0x3a) < *(char *)(lVar3 + 0x3a)) goto LAB_001225ef;
        if (*(char *)(lVar4 + 0x3a) <= *(char *)(lVar3 + 0x3a)) {
          if (*(char *)(lVar2 + 0x7a) < *(char *)(lVar1 + 0x7a)) goto LAB_001225ef;
          if (*(char *)(lVar2 + 0x7a) <= *(char *)(lVar1 + 0x7a)) {
            iVar5 = strcmp((char *)(lVar1 + 0x78),(char *)(lVar2 + 0x78));
            if (iVar5 != 0) goto LAB_001225fd;
            if (*(char *)(lVar2 + 0x7d) < *(char *)(lVar1 + 0x7d)) goto LAB_001225ef;
            if (*(char *)(lVar2 + 0x7d) <= *(char *)(lVar1 + 0x7d)) {
              if (*(double *)(lVar2 + 0x38) < *(double *)(lVar1 + 0x38) + -0.001) goto LAB_001225ef;
              if (*(double *)(lVar2 + 0x38) <= *(double *)(lVar1 + 0x38) + 0.001) {
                if (*(double *)(lVar2 + 0x40) < *(double *)(lVar1 + 0x40) + -0.001)
                goto LAB_001225ef;
                if (*(double *)(lVar2 + 0x40) <= *(double *)(lVar1 + 0x40) + 0.001) {
                  iVar5 = 1;
                  if ((*(double *)(lVar1 + 0x48) + -0.001 <= *(double *)(lVar2 + 0x48)) &&
                     (iVar5 = -1, *(double *)(lVar2 + 0x48) <= *(double *)(lVar1 + 0x48) + 0.001)) {
                    note("atom duplicated in autobondrot input");
                    iVar5 = 0;
                  }
                  goto LAB_001225fd;
                }
              }
            }
          }
        }
      }
    }
    iVar5 = -1;
  }
  else {
LAB_001225ef:
    iVar5 = 1;
  }
LAB_001225fd:
  return -iVar5;
}

Assistant:

int compareXDBAtomRecs(const void *avptr, const void* bvptr) {
   xformAtomRecords **ar = (xformAtomRecords **)avptr;
   xformAtomRecords **br = (xformAtomRecords **)bvptr;
   atom *a = NULL, *b = NULL;
   int cmpval = 0, t = 0;

   a = ar[0]->a;
   b = br[0]->a;
   
   /* Divide into separate residues. Atom sorting within a residue is less important. */

   if      (strcmp(a->r->chain, b->r->chain) > 0) { cmpval =  1; }
   else if (strcmp(a->r->chain, b->r->chain) < 0) { cmpval = -1; }
   else {
      if      (a->r->resid > b->r->resid) { cmpval =  1; }
      else if (a->r->resid < b->r->resid) { cmpval = -1; }
      else {
	 if      (a->r->resInsCode > b->r->resInsCode) { cmpval =  1; }
	 else if (a->r->resInsCode < b->r->resInsCode) { cmpval = -1; }
	 else {
	    if      (a->atomname[2] > b->atomname[2]) { cmpval =  1; }
	    else if (a->atomname[2] < b->atomname[2]) { cmpval = -1; }
	    else {
	       t = strcmp(a->atomname, b->atomname);
	       if (t != 0) { cmpval = t; }
	       else {
		  if      (a->altConf > b->altConf) { cmpval =  1; }
		  else if (a->altConf < b->altConf) { cmpval = -1; }
		  else {
		     if      (a->loc.x - 0.001 > b->loc.x) { cmpval =  1; }
		     else if (a->loc.x + 0.001 < b->loc.x) { cmpval = -1; }
		     else {
			if      (a->loc.y - 0.001 > b->loc.y) { cmpval =  1; }
			else if (a->loc.y + 0.001 < b->loc.y) { cmpval = -1; }
			else {
			   if      (a->loc.z - 0.001 > b->loc.z) { cmpval =  1; }
			   else if (a->loc.z + 0.001 < b->loc.z) { cmpval = -1; }
			   else {
			      /* records seem to have the same name and position */

			      note("atom duplicated in autobondrot input");

			      cmpval = 0;
			   }
			}
		     }
		  }
	       }
	    }
	 }
      }
   }

   return -cmpval; /* invert sort order because the list will be built "CONSed" (appended) */
}